

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench.cc
# Opt level: O0

void __thiscall leveldb::Benchmark::PrintHeader(Benchmark *this)

{
  int kKeySize;
  Benchmark *this_local;
  
  PrintEnvironment(this);
  fprintf(_stdout,"Keys:       %d bytes each\n",0x10);
  fprintf(_stdout,"Values:     %d bytes each (%d bytes after compression)\n",
          (ulong)(uint)FLAGS_value_size,
          (ulong)(uint)(int)((double)FLAGS_value_size * FLAGS_compression_ratio + 0.5));
  fprintf(_stdout,"Entries:    %d\n",(ulong)(uint)this->num_);
  fprintf(_stdout,"RawSize:    %.1f MB (estimated)\n",
          (double)((long)(FLAGS_value_size + 0x10) * (long)this->num_) / 1048576.0);
  fprintf(_stdout,"FileSize:   %.1f MB (estimated)\n",
          (((double)FLAGS_value_size * FLAGS_compression_ratio + 16.0) * (double)this->num_) /
          1048576.0);
  PrintWarnings(this);
  fprintf(_stdout,"------------------------------------------------\n");
  return;
}

Assistant:

void PrintHeader() {
    const int kKeySize = 16;
    PrintEnvironment();
    fprintf(stdout, "Keys:       %d bytes each\n", kKeySize);
    fprintf(stdout, "Values:     %d bytes each (%d bytes after compression)\n",
            FLAGS_value_size,
            static_cast<int>(FLAGS_value_size * FLAGS_compression_ratio + 0.5));
    fprintf(stdout, "Entries:    %d\n", num_);
    fprintf(stdout, "RawSize:    %.1f MB (estimated)\n",
            ((static_cast<int64_t>(kKeySize + FLAGS_value_size) * num_) /
             1048576.0));
    fprintf(stdout, "FileSize:   %.1f MB (estimated)\n",
            (((kKeySize + FLAGS_value_size * FLAGS_compression_ratio) * num_) /
             1048576.0));
    PrintWarnings();
    fprintf(stdout, "------------------------------------------------\n");
  }